

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void string_suite::test_escape_reverse_solidus(void)

{
  basic_string_view<char,_std::char_traits<char>_> *this;
  char *msg;
  allocator<char> local_1b1;
  undefined1 local_1b0 [8];
  string value;
  undefined1 local_180 [8];
  iarchive in;
  char input [5];
  
  in.member.reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  in.member.reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x225c5c22;
  this = (basic_string_view<char,_std::char_traits<char>_> *)((long)&value.field_2 + 8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this,(char *)((long)&in.member.reader.stack.c.
                                  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                                  ._M_impl + 0x10));
  trial::protocol::json::basic_iarchive<char>::basic_iarchive
            ((basic_iarchive<char> *)local_180,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,"EMPTY",&local_1b1);
  std::allocator<char>::~allocator(&local_1b1);
  boost::archive::detail::interface_iarchive<trial::protocol::json::basic_iarchive<char>>::
  operator>>((interface_iarchive<trial::protocol::json::basic_iarchive<char>> *)local_180,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("value","\"\\\\\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0xef,"void string_suite::test_escape_reverse_solidus()",local_1b0,"\\");
  std::__cxx11::string::~string((string *)local_1b0);
  trial::protocol::json::basic_iarchive<char>::~basic_iarchive((basic_iarchive<char> *)local_180);
  return;
}

Assistant:

void test_escape_reverse_solidus()
{
    const char input[] = "\"\\\\\"";
    json::iarchive in(input);
    std::string value("EMPTY");
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value, "\\");
}